

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

Path * __thiscall
RuntimeObjectSystem::FindFile
          (Path *__return_storage_ptr__,RuntimeObjectSystem *this,Path *input,bool *pFound)

{
  TFileMap *this_00;
  ICompilerLogger *pIVar1;
  bool bVar2;
  bool bVar3;
  mapped_type *pmVar4;
  _Rb_tree_header *p_Var5;
  iterator iVar6;
  _Base_ptr p_Var7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  Path directory;
  Path checkFromCurrentDir;
  Path requestedDirectory;
  TFileList requestedSubPaths;
  Path foundDir;
  Path existingPath;
  Path filename;
  Path directory_1;
  Path toCheck;
  Path local_58;
  
  if ((input->m_string)._M_string_length == 0) {
    bVar11 = true;
  }
  else {
    bVar11 = *(input->m_string)._M_dataplus._M_p != '/';
  }
  FileSystemUtils::Path::Path(&requestedDirectory,input);
  filename.m_string._M_dataplus._M_p = (pointer)&filename.m_string.field_2;
  filename._vptr_Path = (_func_int **)&PTR__Path_0011aa10;
  filename.m_string._M_string_length = 0;
  filename.m_string.field_2._M_local_buf[0] = '\0';
  FileSystemUtils::Path::Path(__return_storage_ptr__,input);
  bVar2 = FileSystemUtils::Path::HasExtension(input);
  if (bVar2) {
    FileSystemUtils::Path::ParentPath(&checkFromCurrentDir,&requestedDirectory);
    std::__cxx11::string::_M_assign((string *)&requestedDirectory.m_string);
    FileSystemUtils::Path::~Path(&checkFromCurrentDir);
    FileSystemUtils::Path::Filename(&checkFromCurrentDir,input);
    std::__cxx11::string::_M_assign((string *)&filename.m_string);
    FileSystemUtils::Path::~Path(&checkFromCurrentDir);
  }
  if (bVar11) {
    FileSystemUtils::GetCurrentPath();
    FileSystemUtils::operator/(&checkFromCurrentDir,&foundDir,input);
    FileSystemUtils::Path::~Path(&foundDir);
    bVar11 = FileSystemUtils::Path::Exists(&checkFromCurrentDir);
    if (bVar11) {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_string);
      FileSystemUtils::GetCurrentPath();
      FileSystemUtils::operator/(&foundDir,&directory,&requestedDirectory);
      std::__cxx11::string::_M_assign((string *)&requestedDirectory.m_string);
      FileSystemUtils::Path::~Path(&foundDir);
      FileSystemUtils::Path::~Path(&directory);
    }
    FileSystemUtils::Path::~Path(&checkFromCurrentDir);
  }
  bVar11 = FileSystemUtils::Path::Exists(&requestedDirectory);
  this_00 = &this->m_FoundSourceDirectoryMappings;
  if (bVar11) {
    pmVar4 = std::
             map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::operator[](this_00,&requestedDirectory);
    std::__cxx11::string::_M_assign((string *)&pmVar4->m_string);
  }
  else if ((this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_node_count
           != 0) {
    FileSystemUtils::Path::Path(&checkFromCurrentDir,&requestedDirectory);
    foundDir._vptr_Path = (_func_int **)&PTR__Path_0011aa10;
    foundDir.m_string._M_dataplus._M_p = (pointer)&foundDir.m_string.field_2;
    foundDir.m_string._M_string_length = 0;
    foundDir.m_string.field_2._M_local_buf[0] = '\0';
    p_Var5 = &(this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header;
    iVar8 = 0;
    while( true ) {
      bVar11 = FileSystemUtils::Path::HasParentPath(&checkFromCurrentDir);
      if (!bVar11) break;
      iVar6 = std::
              _Rb_tree<FileSystemUtils::Path,_std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>,_std::_Select1st<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
              ::find(&this_00->_M_t,&checkFromCurrentDir);
      if ((_Rb_tree_header *)iVar6._M_node != p_Var5) {
        std::__cxx11::string::_M_assign((string *)&foundDir.m_string);
        if (iVar8 == 0) {
          FileSystemUtils::operator/(&directory,&foundDir,&filename);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_string);
          FileSystemUtils::Path::~Path(&directory);
          goto LAB_0011068f;
        }
        FileSystemUtils::Path::Path(&directory,&requestedDirectory);
        std::__cxx11::string::replace
                  ((ulong)&directory.m_string,0,
                   (string *)checkFromCurrentDir.m_string._M_string_length);
        bVar11 = FileSystemUtils::Path::Exists(&directory);
        if (bVar11) {
          FileSystemUtils::operator/(&existingPath,&directory,&filename);
          std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_string);
          FileSystemUtils::Path::~Path(&existingPath);
          bVar11 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
          if (!bVar11) goto LAB_0011036c;
          pmVar4 = std::
                   map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                   ::operator[](this_00,&requestedDirectory);
          std::__cxx11::string::_M_assign((string *)&pmVar4->m_string);
          pIVar1 = this->m_pCompilerLogger;
          bVar11 = true;
          if (pIVar1 != (ICompilerLogger *)0x0) {
            (**(code **)(*(long *)pIVar1 + 0x10))
                      (pIVar1,"Found Directory Mapping: %s to %s\n",
                       requestedDirectory.m_string._M_dataplus._M_p,
                       directory.m_string._M_dataplus._M_p);
          }
        }
        else {
LAB_0011036c:
          bVar11 = false;
        }
        FileSystemUtils::Path::~Path(&directory);
        if (!bVar11) goto LAB_00110381;
        goto LAB_0011068f;
      }
      FileSystemUtils::Path::ParentPath(&directory,&checkFromCurrentDir);
      std::__cxx11::string::_M_assign((string *)&checkFromCurrentDir.m_string);
      FileSystemUtils::Path::~Path(&directory);
      iVar8 = iVar8 + -1;
    }
    bVar11 = false;
LAB_00110381:
    requestedSubPaths.
    super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    requestedSubPaths.
    super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    requestedSubPaths.
    super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    FileSystemUtils::Path::Path(&directory,&requestedDirectory);
    while( true ) {
      bVar2 = FileSystemUtils::Path::HasParentPath(&directory);
      if (!bVar2) break;
      std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
                (&requestedSubPaths,&directory);
      FileSystemUtils::Path::ParentPath(&existingPath,&directory);
      std::__cxx11::string::_M_assign((string *)&directory.m_string);
      FileSystemUtils::Path::~Path(&existingPath);
    }
    p_Var7 = (this->m_FoundSourceDirectoryMappings)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_left;
    while (((_Rb_tree_header *)p_Var7 != p_Var5 && (!bVar11))) {
      FileSystemUtils::Path::Path(&existingPath,(Path *)&p_Var7[2]._M_parent);
      while( true ) {
        bVar2 = FileSystemUtils::Path::HasParentPath(&existingPath);
        if ((!bVar2) || (bVar11)) break;
        uVar9 = 0xffffffffffffffff;
        lVar10 = 0;
        do {
          uVar9 = uVar9 + 1;
          if ((ulong)(((long)requestedSubPaths.
                             super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)requestedSubPaths.
                            super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x28) <= uVar9) break;
          FileSystemUtils::Path::Filename
                    (&directory_1,
                     (Path *)((long)&(requestedSubPaths.
                                      super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_vptr_Path +
                             lVar10));
          FileSystemUtils::operator/(&toCheck,&existingPath,&directory_1);
          FileSystemUtils::Path::~Path(&directory_1);
          bVar3 = FileSystemUtils::Path::Exists(&toCheck);
          bVar2 = true;
          if (bVar3) {
            FileSystemUtils::Path::Path(&directory_1,&requestedDirectory);
            std::__cxx11::string::replace
                      ((ulong)&directory_1.m_string,0,
                       *(string **)
                        ((long)&((requestedSubPaths.
                                  super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_string).
                                _M_string_length + lVar10));
            bVar3 = FileSystemUtils::Path::Exists(&directory_1);
            bVar2 = true;
            if (bVar3) {
              FileSystemUtils::operator/(&local_58,&directory_1,&filename);
              std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->m_string);
              FileSystemUtils::Path::~Path(&local_58);
              bVar3 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
              if (bVar3) {
                pmVar4 = std::
                         map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                         ::operator[](this_00,&requestedDirectory);
                std::__cxx11::string::_M_assign((string *)&pmVar4->m_string);
                pIVar1 = this->m_pCompilerLogger;
                bVar11 = true;
                if (pIVar1 == (ICompilerLogger *)0x0) {
                  bVar2 = false;
                }
                else {
                  bVar2 = false;
                  (**(code **)(*(long *)pIVar1 + 0x10))
                            (pIVar1,"Found Directory Mapping: %s to %s\n",
                             requestedDirectory.m_string._M_dataplus._M_p,
                             directory_1.m_string._M_dataplus._M_p);
                }
              }
            }
            FileSystemUtils::Path::~Path(&directory_1);
          }
          lVar10 = lVar10 + 0x28;
          FileSystemUtils::Path::~Path(&toCheck);
        } while (bVar2);
        FileSystemUtils::Path::ParentPath(&toCheck,&existingPath);
        std::__cxx11::string::_M_assign((string *)&existingPath.m_string);
        FileSystemUtils::Path::~Path(&toCheck);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      FileSystemUtils::Path::~Path(&existingPath);
    }
    FileSystemUtils::Path::~Path(&directory);
    std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
              (&requestedSubPaths);
LAB_0011068f:
    FileSystemUtils::Path::~Path(&foundDir);
    FileSystemUtils::Path::~Path(&checkFromCurrentDir);
  }
  bVar11 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
  if (pFound != (bool *)0x0) {
    *pFound = bVar11;
  }
  if ((!bVar11) && (pIVar1 = this->m_pCompilerLogger, pIVar1 != (ICompilerLogger *)0x0)) {
    (**(code **)(*(long *)pIVar1 + 8))
              (pIVar1,"Could not find Directory Mapping for: %s\n",
               (input->m_string)._M_dataplus._M_p);
  }
  FileSystemUtils::Path::~Path(&filename);
  FileSystemUtils::Path::~Path(&requestedDirectory);
  return __return_storage_ptr__;
}

Assistant:

FileSystemUtils::Path RuntimeObjectSystem::FindFile( const FileSystemUtils::Path& input, bool* pFound )
{
    // we want absolute paths, but path might be relative - do a quick check:
    bool bMaybeRelative = true;
    #ifdef _WIN32
        // Note: C:MyDir is actually a relative path but we do not handle these as unlikely to be produced by __FILE__ input
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '\\' )
            {
                bMaybeRelative = false;
            }
            else if( input.m_string.size() >= 2 && input.m_string[1] == ':' )
            {
                bMaybeRelative = false;
            }
        }
    #else
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '/' )
            {
                bMaybeRelative = false;
            }
        }
    #endif


    FileSystemUtils::Path requestedDirectory = input;
    FileSystemUtils::Path filename;
    FileSystemUtils::Path foundFile = input;
    bool bIsFile = input.HasExtension();
    if( bIsFile )
    {
        requestedDirectory = requestedDirectory.ParentPath();
        filename = input.Filename();
    }

    if( bMaybeRelative )
    {
        // Test with input path as it might be just a file name, leading to empty requestedDirectory
        // which would always match current dir.
        FileSystemUtils::Path checkFromCurrentDir = FileSystemUtils::GetCurrentPath() / input;
        if( checkFromCurrentDir.Exists() )
        {
            foundFile = checkFromCurrentDir;
            requestedDirectory = FileSystemUtils::GetCurrentPath() / requestedDirectory;
        }
    }

    requestedDirectory.ToOSCanonicalCase();
    filename.ToOSCanonicalCase();
    foundFile.ToOSCanonicalCase();

    // Step 1: Try input directory
    if( requestedDirectory.Exists() )
    {
        m_FoundSourceDirectoryMappings[ requestedDirectory ] = requestedDirectory;
    }
    else
    {
        // Step 2: Attempt to find a pre-existing mapping
        bool bFoundMapping = false;
        if( m_FoundSourceDirectoryMappings.size() )
        {
            FileSystemUtils::Path testDir = requestedDirectory;
            FileSystemUtils::Path foundDir;
            unsigned int depth = 0;
            bool bFound = false;
            while( testDir.HasParentPath() )
            {
                TFileMapIterator itrFind = m_FoundSourceDirectoryMappings.find( testDir );
                if( itrFind != m_FoundSourceDirectoryMappings.end() )
                {
                    foundDir = itrFind->second;
                    bFound = true;
                    break;
                }

                testDir = testDir.ParentPath();
                ++depth;
            }

            if( bFound )
            {
                if( depth )
                {
                    // not an exact match
                    FileSystemUtils::Path directory = requestedDirectory;
                    directory.m_string.replace( 0, testDir.m_string.length(), foundDir.m_string );
                    if( directory.Exists() )
                    {
                        foundFile = directory / filename;
                        if( foundFile.Exists() )
                        {
                            m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                            if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                            bFoundMapping = true;
                        }
                    }

                }
                else
                {
                    // exact match
                    foundFile = foundDir / filename;
                    bFoundMapping = true;
                }
            }
            
            if( !bFoundMapping )
            {
                // Step 3: Attempt to find a mapping from a known path
                TFileList requestedSubPaths;
                FileSystemUtils::Path requestedSubPath = requestedDirectory;
                while( requestedSubPath.HasParentPath() )
                {
                    requestedSubPaths.push_back( requestedSubPath );
                    requestedSubPath = requestedSubPath.ParentPath();
                }

                TFileMapIterator itr = m_FoundSourceDirectoryMappings.begin();
                while( ( itr != m_FoundSourceDirectoryMappings.end() ) && !bFoundMapping )
                {
                    FileSystemUtils::Path existingPath = itr->second;
                    while( ( existingPath.HasParentPath() ) && !bFoundMapping )
                    {
                        // check all potentials
                        for( size_t i=0; i<requestedSubPaths.size(); ++i )
                        {
                            FileSystemUtils::Path toCheck = existingPath / requestedSubPaths[i].Filename();
                            if( toCheck.Exists() )
                            {
                                // potential mapping
                                FileSystemUtils::Path directory = requestedDirectory;
                                directory.m_string.replace( 0, requestedSubPaths[i].m_string.length(), toCheck.m_string );
                                if( directory.Exists() )
                                {
                                    foundFile = directory / filename;
                                    if( foundFile.Exists() )
                                    {
                                        m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                                        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                                        bFoundMapping = true;
                                        break;
                                    }
                                }
                            }
                        }
                        existingPath = existingPath.ParentPath();
                    }
                    ++itr;
                }
            }
        }

        foundFile.ToOSCanonicalCase();
    }

    bool bFound = foundFile.Exists();
    if( pFound )
    {
        *pFound = bFound;
    }
    if( !bFound )
    {
        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogWarning( "Could not find Directory Mapping for: %s\n", input.c_str() ); }
    }
    return foundFile;
}